

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-attack.c
# Opt level: O1

wchar_t borg_attack_aux_trance(void)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  int iVar5;
  
  _Var1 = borg_spell_okay(TRANCE);
  wVar2 = L'\0';
  if (_Var1) {
    borg_sleep_spell_ii = false;
    wVar2 = borg_danger(borg.c.y,borg.c.x,L'\x04',true,false);
    borg_sleep_spell_ii = true;
    wVar3 = borg_danger(borg.c.y,borg.c.x,L'\x04',true,false);
    borg_sleep_spell_ii = false;
    wVar4 = borg_get_spell_power(TRANCE);
    iVar5 = wVar4 * -10;
    if (borg.trait[0x1f] / 2 <= borg.trait[0x1e] - wVar4) {
      iVar5 = 0;
    }
    wVar2 = (wVar2 - (wVar3 + wVar4)) + iVar5;
    if (borg_simulate == false) {
      _Var1 = borg_spell(TRANCE);
      if (!_Var1) {
        wVar2 = L'\0';
      }
    }
  }
  return wVar2;
}

Assistant:

static int borg_attack_aux_trance(void)
{
    int p1 = 0;
    int p2 = 0;
    int d  = 0;

    /* Can I do it */
    if (!borg_spell_okay(TRANCE))
        return 0;

    /* Obtain initial danger */
    borg_sleep_spell_ii = false;
    p1                  = borg_danger(borg.c.y, borg.c.x, 4, true, false);

    /* What effect is there? */
    borg_sleep_spell_ii = true;
    p2                  = borg_danger(borg.c.y, borg.c.x, 4, true, false);
    borg_sleep_spell_ii = false;

    /* value is d, enhance the value for rogues and rangers so that
     * they can use their critical hits.
     */
    d               = (p1 - p2);

    int spell_power = borg_get_spell_power(TRANCE);

    /* Penalize mana usage */
    d = d - spell_power;

    /* Penalize use of reserve mana */
    if (borg.trait[BI_CURSP] - spell_power < borg.trait[BI_MAXSP] / 2)
        d = d - (spell_power * 10);

    /* Simulation */
    if (borg_simulate)
        return d;

    /* Cast the spell */
    if (borg_spell(TRANCE))
        return d;

    return 0;
}